

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utrie.cpp
# Opt level: O2

uint32_t defaultGetFoldedValue(UNewTrie *trie,UChar32 start,int32_t offset)

{
  int iVar1;
  uint32_t uVar2;
  undefined4 in_EAX;
  uint32_t uVar3;
  int iVar4;
  UBool inBlockZero;
  undefined8 uStack_38;
  uint32_t uStack_34;
  
  uStack_38 = CONCAT44(offset,in_EAX);
  uVar2 = *trie->data;
  iVar1 = start + 0x400;
  while( true ) {
    if (iVar1 <= start) {
      return 0;
    }
    uVar3 = utrie_get32_63(trie,start,&inBlockZero);
    iVar4 = 0x20;
    if ((inBlockZero == '\0') && (iVar4 = 1, uVar3 != uVar2)) break;
    start = start + iVar4;
  }
  return uStack_34;
}

Assistant:

static uint32_t U_CALLCONV
defaultGetFoldedValue(UNewTrie *trie, UChar32 start, int32_t offset) {
    uint32_t value, initialValue;
    UChar32 limit;
    UBool inBlockZero;

    initialValue=trie->data[0];
    limit=start+0x400;
    while(start<limit) {
        value=utrie_get32(trie, start, &inBlockZero);
        if(inBlockZero) {
            start+=UTRIE_DATA_BLOCK_LENGTH;
        } else if(value!=initialValue) {
            return (uint32_t)offset;
        } else {
            ++start;
        }
    }
    return 0;
}